

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

void matd_scale_inplace(matd_t *a,double s)

{
  int iVar1;
  ulong uVar2;
  uint local_20;
  uint local_1c;
  int j;
  int i;
  double s_local;
  matd_t *a_local;
  
  if (a != (matd_t *)0x0) {
    iVar1 = matd_is_scalar(a);
    if (iVar1 == 0) {
      for (local_1c = 0; local_1c < a->nrows; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < a->ncols; local_20 = local_20 + 1) {
          uVar2 = (ulong)(local_1c * a->ncols + local_20);
          a[uVar2 + 1] = (matd_t)(s * (double)a[uVar2 + 1]);
        }
      }
    }
    else {
      a[1] = (matd_t)(s * (double)a[1]);
    }
    return;
  }
  __assert_fail("a != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x114,"void matd_scale_inplace(matd_t *, double)");
}

Assistant:

void matd_scale_inplace(matd_t *a, double s)
{
    assert(a != NULL);

    if (matd_is_scalar(a)) {
        a->data[0] *= s;
        return;
    }

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(a, i, j) *= s;
        }
    }
}